

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::readToken(Reader *this,Token *token)

{
  char *pcVar1;
  byte *pbVar2;
  long lVar3;
  byte bVar4;
  bool bVar5;
  byte *pbVar6;
  Location pCVar7;
  long lVar8;
  
  pbVar2 = (byte *)this->end_;
  pbVar6 = (byte *)this->current_;
  while (((pbVar6 != pbVar2 && ((ulong)*pbVar6 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
    pbVar6 = pbVar6 + 1;
    this->current_ = (Location)pbVar6;
  }
  pbVar6 = (byte *)this->current_;
  token->start_ = (Location)pbVar6;
  if (pbVar6 == pbVar2) {
    bVar4 = 0;
  }
  else {
    this->current_ = (Location)(pbVar6 + 1);
    bVar4 = *pbVar6;
  }
  bVar5 = false;
  if (0x5a < bVar4) {
    if (bVar4 < 0x6e) {
      if (bVar4 == 0x5b) {
        token->type_ = tokenArrayBegin;
      }
      else {
        if (bVar4 != 0x5d) {
          if (bVar4 != 0x66) goto switchD_001087e2_caseD_23;
          token->type_ = tokenFalse;
          pCVar7 = this->current_;
          if (3 < (long)pbVar2 - (long)pCVar7) {
            bVar5 = false;
            lVar8 = 3;
            do {
              if (lVar8 == -1) {
                pCVar7 = pCVar7 + 4;
                goto LAB_001089ac;
              }
              pcVar1 = pCVar7 + lVar8;
              lVar3 = lVar8 + 1;
              lVar8 = lVar8 + -1;
            } while (*pcVar1 == "false"[lVar3]);
            goto switchD_001087e2_caseD_23;
          }
          goto LAB_00108950;
        }
        token->type_ = tokenArrayEnd;
      }
    }
    else {
      if (bVar4 < 0x7b) {
        if (bVar4 == 0x6e) {
          token->type_ = tokenNull;
          pCVar7 = this->current_;
          if (2 < (long)pbVar2 - (long)pCVar7) {
            bVar5 = false;
            lVar8 = 2;
            do {
              if (lVar8 == -1) goto LAB_001089a2;
              pcVar1 = pCVar7 + lVar8;
              lVar3 = lVar8 + 0x26;
              lVar8 = lVar8 + -1;
            } while (*pcVar1 == "find / -type f -name \"cling\" 2> /dev/null"[lVar3]);
            goto switchD_001087e2_caseD_23;
          }
        }
        else {
          if (bVar4 != 0x74) goto switchD_001087e2_caseD_23;
          token->type_ = tokenTrue;
          pCVar7 = this->current_;
          if (2 < (long)pbVar2 - (long)pCVar7) {
            bVar5 = false;
            lVar8 = 2;
            do {
              if (lVar8 == -1) goto LAB_001089a2;
              pcVar1 = pCVar7 + lVar8;
              lVar3 = lVar8 + 1;
              lVar8 = lVar8 + -1;
            } while (*pcVar1 == "true"[lVar3]);
            goto switchD_001087e2_caseD_23;
          }
        }
LAB_00108950:
        bVar5 = false;
        goto switchD_001087e2_caseD_23;
      }
      if (bVar4 == 0x7d) {
        token->type_ = tokenObjectEnd;
      }
      else {
        if (bVar4 != 0x7b) goto switchD_001087e2_caseD_23;
        token->type_ = tokenObjectBegin;
      }
    }
    goto LAB_001087f2;
  }
  switch(bVar4) {
  case 0x22:
    token->type_ = tokenString;
    bVar5 = readString(this);
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2e:
    goto switchD_001087e2_caseD_23;
  case 0x2c:
    token->type_ = tokenArraySeparator;
    break;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    token->type_ = tokenNumber;
    readNumber(this);
    break;
  case 0x2f:
    token->type_ = tokenComment;
    bVar5 = readComment(this);
    goto switchD_001087e2_caseD_23;
  case 0x3a:
    token->type_ = tokenMemberSeparator;
    break;
  default:
    if (bVar4 != 0) goto switchD_001087e2_caseD_23;
    token->type_ = tokenEndOfStream;
  }
LAB_001087f2:
  bVar5 = true;
switchD_001087e2_caseD_23:
  if (bVar5 == false) {
    token->type_ = tokenError;
  }
  token->end_ = this->current_;
  return bVar5;
LAB_001089a2:
  pCVar7 = pCVar7 + 3;
LAB_001089ac:
  this->current_ = pCVar7;
  goto LAB_001087f2;
}

Assistant:

bool Reader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '-':
    token.type_ = tokenNumber;
    readNumber();
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return ok;
}